

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool IsBIP30Unspendable(CBlockIndex *block_index)

{
  uint256 *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (block_index->nHeight == 0x166a4) {
    puVar1 = block_index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
LAB_00b25014:
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    auVar4[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == '/');
    auVar4[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == 'o');
    auVar4[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == '0');
    auVar4[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == 0xf9);
    auVar4[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == 0xd6);
    auVar4[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == 0x83);
    auVar4[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == 0xde);
    auVar4[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == 0xb8);
    auVar4[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == ']');
    auVar4[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == 0x93);
    auVar4[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == '\x14');
    auVar4[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == 0xef);
    auVar4[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == ']');
    auVar4[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == 0xcf);
    auVar4[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == '6');
    auVar4[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == 0xaf);
    auVar6[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == 'f');
    auVar6[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == 0xd9);
    auVar6[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == 0xe3);
    auVar6[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == 0xce);
    auVar6[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == '\x1a');
    auVar6[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == '+');
    auVar6[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == 'y');
    auVar6[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == 0xd4);
    auVar6[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == 0xae);
    auVar6[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == 0xf0);
    auVar6[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == '\n');
    auVar6[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
    auVar6[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
    auVar6[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
    auVar6[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
    auVar6[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
    auVar6 = auVar6 & auVar4;
    bVar2 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
  }
  else {
    if (block_index->nHeight == 0x1664a) {
      puVar1 = block_index->phashBlock;
      if (puVar1 == (uint256 *)0x0) goto LAB_00b25014;
      auVar5[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x10] == 0xf2);
      auVar5[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x11] == '\x19');
      auVar5[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x12] == 0x84);
      auVar5[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x13] == '\x7f');
      auVar5[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x14] == 'f');
      auVar5[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x15] == 0xe7);
      auVar5[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x16] == '&');
      auVar5[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x17] == 0xdc);
      auVar5[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x18] == 0xa2);
      auVar5[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x19] == 'q');
      auVar5[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1a] == '\x02');
      auVar5[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1b] == '\0');
      auVar5[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1c] == '\0');
      auVar5[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1d] == '\0');
      auVar5[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1e] == '\0');
      auVar5[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0x1f] == '\0');
      auVar3[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == 0x8e);
      auVar3[1] = -((puVar1->super_base_blob<256U>).m_data._M_elems[1] == 0xd0);
      auVar3[2] = -((puVar1->super_base_blob<256U>).m_data._M_elems[2] == 'M');
      auVar3[3] = -((puVar1->super_base_blob<256U>).m_data._M_elems[3] == 'W');
      auVar3[4] = -((puVar1->super_base_blob<256U>).m_data._M_elems[4] == 0xf2);
      auVar3[5] = -((puVar1->super_base_blob<256U>).m_data._M_elems[5] == 0xf3);
      auVar3[6] = -((puVar1->super_base_blob<256U>).m_data._M_elems[6] == 0xcd);
      auVar3[7] = -((puVar1->super_base_blob<256U>).m_data._M_elems[7] == 0xc6);
      auVar3[8] = -((puVar1->super_base_blob<256U>).m_data._M_elems[8] == 0xa6);
      auVar3[9] = -((puVar1->super_base_blob<256U>).m_data._M_elems[9] == 0xe5);
      auVar3[10] = -((puVar1->super_base_blob<256U>).m_data._M_elems[10] == 'U');
      auVar3[0xb] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xb] == 'i');
      auVar3[0xc] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xc] == 0xdc);
      auVar3[0xd] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xd] == '\x16');
      auVar3[0xe] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xe] == 'T');
      auVar3[0xf] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0xf] == 0xe1);
      auVar5 = auVar5 & auVar3;
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
        bVar2 = true;
        goto LAB_00b24ff4;
      }
    }
    bVar2 = false;
  }
LAB_00b24ff4:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBIP30Unspendable(const CBlockIndex& block_index)
{
    return (block_index.nHeight==91722 && block_index.GetBlockHash() == uint256{"00000000000271a2dc26e7667f8419f2e15416dc6955e5a6c6cdf3f2574dd08e"}) ||
           (block_index.nHeight==91812 && block_index.GetBlockHash() == uint256{"00000000000af0aed4792b1acee3d966af36cf5def14935db8de83d6f9306f2f"});
}